

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O2

void __thiscall
TI::TMS::SMSSequencer<(TI::TMS::Personality)3>::fetch<17>
          (SMSSequencer<(TI::TMS::Personality)3> *this)

{
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,0);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,1);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,2);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,3);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,4);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,5);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,6);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,7);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,8);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,9);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,10);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,0xb);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,0xc);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,0xd);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,0xe);
  SMSFetcher<(TI::TMS::Personality)3>::posit_sprite(&this->fetcher,0xf);
  return;
}

Assistant:

void fetch() {
		if(cycle < 3) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 3) {
			fetcher.fetch_sprite(4);
			fetcher.fetch_sprite(5);
			fetcher.fetch_sprite(6);
			fetcher.fetch_sprite(7);
		}

		if(cycle == 15 || cycle == 16) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 17) {
			fetcher.posit_sprite(0);	fetcher.posit_sprite(1);	fetcher.posit_sprite(2);	fetcher.posit_sprite(3);
			fetcher.posit_sprite(4);	fetcher.posit_sprite(5);	fetcher.posit_sprite(6);	fetcher.posit_sprite(7);
			fetcher.posit_sprite(8);	fetcher.posit_sprite(9);	fetcher.posit_sprite(10);	fetcher.posit_sprite(11);
			fetcher.posit_sprite(12);	fetcher.posit_sprite(13);	fetcher.posit_sprite(14);	fetcher.posit_sprite(15);
		}

		if(cycle >= 25 && cycle < 153) {
			constexpr int offset = cycle - 25;
			constexpr int block = offset >> 2;
			constexpr int sub_block = offset & 3;

			switch(sub_block) {
				default: break;

				case 0:	fetcher.fetch_tile_name(block);		break;
				case 1:
					if(!(block & 3)) {
						fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
					} else {
						constexpr int sprite = (8 + ((block >> 2) * 3) + ((block & 3) - 1)) << 1;
						fetcher.posit_sprite(sprite);
						fetcher.posit_sprite(sprite+1);
					}
				break;
				case 2:	fetcher.fetch_tile_pattern(block);	break;
			}
		}

		if(cycle >= 153 && cycle < 157) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}

		if(cycle == 157) {
			fetcher.fetch_sprite(0);
			fetcher.fetch_sprite(1);
			fetcher.fetch_sprite(2);
			fetcher.fetch_sprite(3);
		}

		if(cycle >= 169) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
		}
	}